

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_encoder.c
# Opt level: O2

aom_codec_err_t
aom_codec_enc_config_default(aom_codec_iface_t *iface,aom_codec_enc_cfg_t *cfg,uint usage)

{
  uint uVar1;
  aom_codec_enc_cfg_t *paVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  aom_codec_err_t aVar6;
  
  aVar6 = AOM_CODEC_INVALID_PARAM;
  if (cfg != (aom_codec_enc_cfg_t *)0x0 && iface != (aom_codec_iface_t *)0x0) {
    if ((iface->caps & 2) == 0) {
      aVar6 = AOM_CODEC_INCAPABLE;
    }
    else {
      uVar1 = (iface->enc).cfg_count;
      uVar4 = 0;
      if (0 < (int)uVar1) {
        uVar4 = (ulong)uVar1;
      }
      lVar3 = -0x388;
      do {
        lVar5 = lVar3;
        if (uVar4 * 0x388 - (lVar5 + 0x388) == 0) {
          return AOM_CODEC_INVALID_PARAM;
        }
        paVar2 = (iface->enc).cfgs;
        lVar3 = lVar5 + 0x388;
      } while (*(uint *)((long)&paVar2[1].g_usage + lVar5) != usage);
      memcpy(cfg,(void *)((long)&paVar2[1].g_usage + lVar5),0x300);
      aVar6 = AOM_CODEC_OK;
      memset(&cfg->encoder_cfg,0,0x8c);
      (cfg->encoder_cfg).max_partition_size = 0x80;
      (cfg->encoder_cfg).min_partition_size = 4;
      (cfg->encoder_cfg).disable_trellis_quant = 3;
    }
  }
  return aVar6;
}

Assistant:

aom_codec_err_t aom_codec_enc_config_default(aom_codec_iface_t *iface,
                                             aom_codec_enc_cfg_t *cfg,
                                             unsigned int usage) {
  aom_codec_err_t res;

  if (!iface || !cfg)
    res = AOM_CODEC_INVALID_PARAM;
  else if (!(iface->caps & AOM_CODEC_CAP_ENCODER))
    res = AOM_CODEC_INCAPABLE;
  else {
    res = AOM_CODEC_INVALID_PARAM;

    for (int i = 0; i < iface->enc.cfg_count; ++i) {
      if (iface->enc.cfgs[i].g_usage == usage) {
        *cfg = iface->enc.cfgs[i];
        res = AOM_CODEC_OK;
        /* default values */
        memset(&cfg->encoder_cfg, 0, sizeof(cfg->encoder_cfg));
        cfg->encoder_cfg.super_block_size = 0;  // Dynamic
        cfg->encoder_cfg.max_partition_size = 128;
        cfg->encoder_cfg.min_partition_size = 4;
        cfg->encoder_cfg.disable_trellis_quant = 3;
        break;
      }
    }
  }
  return res;
}